

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::emitDisk(SemanticParser *this,SP *shape)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  bool bVar9;
  element_type *this_00;
  element_type *peVar10;
  SemanticParser *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  float fVar11;
  SP SVar12;
  SP ours;
  shared_ptr<pbrt::syntactic::Material> *in_stack_fffffffffffffe88;
  shared_ptr<pbrt::Disk> *__r;
  shared_ptr<pbrt::Shape> *in_stack_fffffffffffffe90;
  shared_ptr<pbrt::Shape> *this_01;
  shared_ptr<pbrt::Material> *in_stack_fffffffffffffeb8;
  allocator<char> *in_stack_fffffffffffffec0;
  string *name;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  SP *in_stack_fffffffffffffee0;
  shared_ptr<pbrt::Shape> local_f0;
  float in_stack_ffffffffffffff2c;
  string *in_stack_ffffffffffffff30;
  ParamSet *in_stack_ffffffffffffff38;
  SP *in_stack_ffffffffffffff50;
  SP *in_stack_ffffffffffffff58;
  SemanticParser *in_stack_ffffffffffffff60;
  allocator<char> local_79;
  string local_78 [120];
  
  std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1a1c8b);
  std::shared_ptr<pbrt::syntactic::Material>::shared_ptr
            ((shared_ptr<pbrt::syntactic::Material> *)in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe88);
  findOrCreateMaterial(in_RDX,in_stack_fffffffffffffee0);
  std::make_shared<pbrt::Disk,std::shared_ptr<pbrt::Material>>(in_stack_fffffffffffffeb8);
  std::shared_ptr<pbrt::Material>::~shared_ptr((shared_ptr<pbrt::Material> *)0x1a1ce7);
  std::shared_ptr<pbrt::syntactic::Material>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Material> *)0x1a1cf4);
  this_00 = std::
            __shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1a1cfe);
  peVar10 = std::__shared_ptr_access<pbrt::Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<pbrt::Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x1a1d10);
  fVar7 = (this_00->transform).atStart.l.vx.x;
  fVar8 = (this_00->transform).atStart.l.vx.y;
  uVar1 = *(undefined8 *)&(this_00->transform).atStart.l.vx.z;
  fVar3 = (this_00->transform).atStart.l.vy.y;
  fVar4 = (this_00->transform).atStart.l.vy.z;
  fVar5 = (this_00->transform).atStart.l.vz.x;
  fVar6 = (this_00->transform).atStart.l.vz.y;
  fVar11 = (this_00->transform).atStart.p.y;
  fVar2 = (this_00->transform).atStart.p.z;
  *(undefined8 *)&(peVar10->transform).l.vz.z = *(undefined8 *)&(this_00->transform).atStart.l.vz.z;
  (peVar10->transform).p.y = fVar11;
  (peVar10->transform).p.z = fVar2;
  (peVar10->transform).l.vy.y = fVar3;
  (peVar10->transform).l.vy.z = fVar4;
  (peVar10->transform).l.vz.x = fVar5;
  (peVar10->transform).l.vz.y = fVar6;
  (peVar10->transform).l.vx.x = fVar7;
  (peVar10->transform).l.vx.y = fVar8;
  *(undefined8 *)&(peVar10->transform).l.vx.z = uVar1;
  std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1a1d43);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             in_stack_fffffffffffffec0);
  fVar11 = syntactic::ParamSet::getParam1f
                     (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c)
  ;
  peVar10 = std::__shared_ptr_access<pbrt::Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<pbrt::Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x1a1da3);
  peVar10->radius = fVar11;
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1a1dd5);
  name = (string *)&stack0xffffffffffffff5f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)CONCAT44(fVar11,in_stack_fffffffffffffec8),(allocator<char> *)name);
  bVar9 = syntactic::ParamSet::hasParam1f
                    ((ParamSet *)CONCAT44(fVar11,in_stack_fffffffffffffec8),name);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
  if (bVar9) {
    std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1a1e54);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (char *)CONCAT44(fVar11,in_stack_fffffffffffffec8),(allocator<char> *)name);
    fVar11 = syntactic::ParamSet::getParam1f
                       (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                        in_stack_ffffffffffffff2c);
    peVar10 = std::__shared_ptr_access<pbrt::Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<pbrt::Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1a1eb4);
    peVar10->height = fVar11;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
  }
  __r = (shared_ptr<pbrt::Disk> *)&stack0xffffffffffffff20;
  std::shared_ptr<pbrt::Shape>::shared_ptr<pbrt::Disk,void>(in_stack_fffffffffffffe90,__r);
  this_01 = &local_f0;
  std::shared_ptr<pbrt::syntactic::Shape>::shared_ptr
            ((shared_ptr<pbrt::syntactic::Shape> *)this_01,(shared_ptr<pbrt::syntactic::Shape> *)__r
            );
  extractTextures(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::shared_ptr<pbrt::syntactic::Shape>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Shape> *)0x1a2057);
  std::shared_ptr<pbrt::Shape>::~shared_ptr((shared_ptr<pbrt::Shape> *)0x1a2064);
  std::shared_ptr<pbrt::Shape>::shared_ptr<pbrt::Disk,void>(this_01,__r);
  std::shared_ptr<pbrt::Disk>::~shared_ptr((shared_ptr<pbrt::Disk> *)0x1a2083);
  SVar12.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar12.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SP)SVar12.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::emitDisk(pbrt::syntactic::Shape::SP shape)
  {
    Disk::SP ours = std::make_shared<Disk>(findOrCreateMaterial(shape->material));

    ours->transform = shape->transform.atStart;
    ours->radius    = shape->getParam1f("radius");
        
    if (shape->hasParam1f("height"))
      ours->height    = shape->getParam1f("height");
        
    extractTextures(ours,shape);
      
    return ours;
  }